

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# checkbox.cpp
# Opt level: O2

Component __thiscall
ftxui::Checkbox(ftxui *this,ConstStringRef *label,bool *checked,Ref<ftxui::CheckboxOption> *option)

{
  pointer p_Var1;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *__tmp;
  Component CVar2;
  __allocator_type __a2;
  allocator<std::_Sp_counted_ptr_inplace<ftxui::(anonymous_namespace)::CheckboxBase,_std::allocator<ftxui::(anonymous_namespace)::CheckboxBase>,_(__gnu_cxx::_Lock_policy)2>_>
  local_119;
  __allocated_ptr<std::allocator<std::_Sp_counted_ptr_inplace<ftxui::(anonymous_namespace)::CheckboxBase,_std::allocator<ftxui::(anonymous_namespace)::CheckboxBase>,_(__gnu_cxx::_Lock_policy)2>_>_>
  local_118;
  ConstStringRef local_108;
  undefined8 local_e0;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_d8;
  Ref<ftxui::CheckboxOption> local_d0;
  
  p_Var1 = (pointer)operator_new(0x120);
  local_118._M_alloc = &local_119;
  (p_Var1->super__Sp_counted_base<(__gnu_cxx::_Lock_policy)2>)._M_use_count = 1;
  (p_Var1->super__Sp_counted_base<(__gnu_cxx::_Lock_policy)2>)._M_weak_count = 1;
  (p_Var1->super__Sp_counted_base<(__gnu_cxx::_Lock_policy)2>)._vptr__Sp_counted_base =
       (_func_int **)&PTR___Sp_counted_ptr_inplace_00167e90;
  local_118._M_ptr = p_Var1;
  ConstStringRef::ConstStringRef(&local_108,label);
  Ref<ftxui::CheckboxOption>::Ref(&local_d0,option);
  *(undefined8 *)((long)&(p_Var1->_M_impl)._M_storage._M_storage + 0x18) = 0;
  *(undefined8 *)((long)&(p_Var1->_M_impl)._M_storage._M_storage + 0x20) = 0;
  *(undefined8 *)((long)&(p_Var1->_M_impl)._M_storage._M_storage + 8) = 0;
  *(undefined8 *)((long)&(p_Var1->_M_impl)._M_storage._M_storage + 0x10) = 0;
  (p_Var1->_M_impl)._M_storage._M_storage.__align =
       (anon_struct_8_0_00000001_for___align)&PTR__CheckboxBase_00167ee0;
  ConstStringRef::ConstStringRef
            ((ConstStringRef *)((long)&(p_Var1->_M_impl)._M_storage._M_storage + 0x28),&local_108);
  *(bool **)((long)&(p_Var1->_M_impl)._M_storage._M_storage + 0x50) = checked;
  *(undefined8 *)((long)&(p_Var1->_M_impl)._M_storage._M_storage + 0x58) = 0;
  *(undefined8 *)((long)&(p_Var1->_M_impl)._M_storage._M_storage + 0x60) = 0;
  Ref<ftxui::CheckboxOption>::Ref
            ((Ref<ftxui::CheckboxOption> *)((long)&(p_Var1->_M_impl)._M_storage._M_storage + 0x68),
             &local_d0);
  CheckboxOption::~CheckboxOption(&local_d0.owned_);
  std::__cxx11::string::~string((string *)&local_108);
  local_118._M_ptr = (pointer)0x0;
  std::
  __allocated_ptr<std::allocator<std::_Sp_counted_ptr_inplace<ftxui::(anonymous_namespace)::CheckboxBase,_std::allocator<ftxui::(anonymous_namespace)::CheckboxBase>,_(__gnu_cxx::_Lock_policy)2>_>_>
  ::~__allocated_ptr(&local_118);
  *(_Impl **)this = &p_Var1->_M_impl;
  local_d8._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  *(pointer *)(this + 8) = p_Var1;
  local_e0 = 0;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_d8);
  CVar2.super___shared_ptr<ftxui::ComponentBase,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       extraout_RDX._M_pi;
  CVar2.super___shared_ptr<ftxui::ComponentBase,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)this;
  return (Component)CVar2.super___shared_ptr<ftxui::ComponentBase,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

Component Checkbox(ConstStringRef label,
                   bool* checked,
                   Ref<CheckboxOption> option) {
  return Make<CheckboxBase>(label, checked, std::move(option));
}